

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O1

void __thiscall Physical::Physical(Physical *this,Physical *p)

{
  Unit *this_00;
  int i;
  long lVar1;
  
  this->_vptr_Physical = (_func_int **)&PTR__Physical_0015e4b0;
  (this->physicalDescription)._M_dataplus._M_p = (pointer)&(this->physicalDescription).field_2;
  (this->physicalDescription)._M_string_length = 0;
  (this->physicalDescription).field_2._M_local_buf[0] = '\0';
  this_00 = &this->physicalUnit;
  Unit::Unit(this_00);
  std::__cxx11::string::_M_assign((string *)&this->physicalDescription);
  this->dQuantity = p->dQuantity;
  (this->physicalUnit).nExpPrefix = (p->physicalUnit).nExpPrefix;
  lVar1 = 0;
  do {
    (this->physicalUnit).siUnits[lVar1] = (p->physicalUnit).siUnits[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  this_00->bInvalid = (p->physicalUnit).bInvalid;
  Unit::setNames(this_00);
  return;
}

Assistant:

Physical::Physical(const Physical &p)
{
	physicalDescription = p.physicalDescription;
	dQuantity = p.dQuantity;
	physicalUnit = p.physicalUnit;
}